

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall
cmCTestVC::RunChild(cmCTestVC *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *cmd,OutputParser *out,OutputParser *err,string *workDir,Encoding encoding)

{
  ostream *poVar1;
  cmUVProcessChainBuilder *this_00;
  bool bVar2;
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> status;
  cmUVProcessChainBuilder builder;
  _Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> local_c8;
  string local_b0;
  cmUVProcessChainBuilder local_90;
  
  poVar1 = this->Log;
  ComputeCommandLine((string *)&local_90,cmd);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_90);
  if (workDir->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)workDir);
  }
  this_00 = cmUVProcessChainBuilder::AddCommand(&local_90,cmd);
  std::__cxx11::string::string((string *)&local_b0,(string *)workDir);
  cmUVProcessChainBuilder::SetWorkingDirectory(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  cmProcessTools::RunProcess
            ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> *)
             &local_c8,&local_90,out,err,encoding);
  if ((local_c8._M_impl.super__Vector_impl_data._M_start)->SpawnResult == 0) {
    bVar2 = (local_c8._M_impl.super__Vector_impl_data._M_start)->ExitStatus == 0;
  }
  else {
    bVar2 = false;
  }
  std::_Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::
  ~_Vector_base(&local_c8);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&local_90);
  return bVar2;
}

Assistant:

bool cmCTestVC::RunChild(const std::vector<std::string>& cmd,
                         OutputParser* out, OutputParser* err,
                         std::string workDir, Encoding encoding)
{
  this->Log << cmCTestVC::ComputeCommandLine(cmd) << "\n";

  cmUVProcessChainBuilder builder;
  if (workDir.empty()) {
    workDir = this->SourceDirectory;
  }
  builder.AddCommand(cmd).SetWorkingDirectory(workDir);
  auto status = cmCTestVC::RunProcess(builder, out, err, encoding);
  return status.front().SpawnResult == 0 && status.front().ExitStatus == 0;
}